

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxScript.cpp
# Opt level: O2

void __thiscall Jinx::Impl::Script::SetVariableAtIndex(Script *this,RuntimeID id,size_t index)

{
  pointer pIVar1;
  pointer pIVar2;
  size_t index_local;
  RuntimeID id_local;
  ulong local_8;
  
  index_local = index;
  id_local = id;
  if ((ulong)(((long)(this->m_stack).
                     super__Vector_base<Jinx::Variant,_Jinx::StaticAllocator<Jinx::Variant,_4096UL,_16UL>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->m_stack).
                    super__Vector_base<Jinx::Variant,_Jinx::StaticAllocator<Jinx::Variant,_4096UL,_16UL>_>
                    ._M_impl.super__Vector_impl_data._M_start) / 0x28) <= index) {
    __assert_fail("index < m_stack.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/JamesBoer[P]Jinx/Source/JxScript.cpp"
                  ,0x4bf,"void Jinx::Impl::Script::SetVariableAtIndex(RuntimeID, size_t)");
  }
  local_8 = (long)(this->m_execution).
                  super__Vector_base<Jinx::Impl::Script::ExecutionFrame,_Jinx::StaticAllocator<Jinx::Impl::Script::ExecutionFrame,_4096UL,_16UL>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(this->m_execution).
                  super__Vector_base<Jinx::Impl::Script::ExecutionFrame,_Jinx::StaticAllocator<Jinx::Impl::Script::ExecutionFrame,_4096UL,_16UL>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 6;
  pIVar1 = (this->m_idIndexData).
           super__Vector_base<Jinx::Impl::Script::IdIndexData,_Jinx::StaticAllocator<Jinx::Impl::Script::IdIndexData,_4096UL,_16UL>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  while ((pIVar2 = pIVar1,
         pIVar2 != (this->m_idIndexData).
                   super__Vector_base<Jinx::Impl::Script::IdIndexData,_Jinx::StaticAllocator<Jinx::Impl::Script::IdIndexData,_4096UL,_16UL>_>
                   ._M_impl.super__Vector_impl_data._M_start && (local_8 <= pIVar2[-1].frameIndex)))
  {
    pIVar1 = pIVar2 + -1;
    if (pIVar2[-1].id == id) {
      pIVar2[-1].index = index;
      return;
    }
  }
  std::
  vector<Jinx::Impl::Script::IdIndexData,Jinx::StaticAllocator<Jinx::Impl::Script::IdIndexData,4096ul,16ul>>
  ::emplace_back<unsigned_long&,unsigned_long&,unsigned_long>
            ((vector<Jinx::Impl::Script::IdIndexData,Jinx::StaticAllocator<Jinx::Impl::Script::IdIndexData,4096ul,16ul>>
              *)&this->m_idIndexData,&id_local,&index_local,&local_8);
  return;
}

Assistant:

inline_t void Script::SetVariableAtIndex(RuntimeID id, size_t index)
	{
		assert(index < m_stack.size());
		for (auto ritr = m_idIndexData.rbegin(); ritr != m_idIndexData.rend(); ++ritr)
		{
			if (ritr->frameIndex < m_execution.size())
				break;
			if (ritr->id == id)
			{
				ritr->index = index;
				return;
			}
		}
		m_idIndexData.emplace_back(id, index, m_execution.size());
	}